

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall libclient::client::client_loop(client *this)

{
  int iVar1;
  ostream *poVar2;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Sending login request");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"lo",&local_91);
  std::operator+(&local_50,&local_70,&this->client_name);
  std::operator+(&local_90,&local_50,"\n");
  _write_to_socket(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  _read_from_socket(this);
  while (this->_is_started == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ping",(allocator<char> *)&local_70);
    std::operator+(&local_90,&local_50,"\n");
    _write_to_socket(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    _read_from_socket(this);
    process_message(this);
    iVar1 = rand();
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->client_name);
    poVar2 = std::operator<<(poVar2," ping ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 % 7000);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_90._M_dataplus._M_p = (pointer)(long)((iVar1 % 7000) * 1000);
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>
              ((subsecond_duration<boost::posix_time::time_duration,_1000L> *)&local_90);
  }
  return;
}

Assistant:

void libclient::client::client_loop()
{
    /*
        Check if the client has received login success from server and proceed
    */
   std::cout<<"Sending login request"<<std::endl;
   _write_to_socket(_LOGIN_REQUEST_+client_name+"\n");
   _read_from_socket();
   while(_is_started)
   {
       _write_to_socket(_PING_REQUEST_+"\n");
       _read_from_socket();
        process_message();
       int sl = rand()%7000;
       std::cout<<client_name<<" ping "<<sl<<std::endl;
       boost::this_thread::sleep(boost::posix_time::millisec(sl));

   }

}